

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

string * (anonymous_namespace)::get_suffixes_abi_cxx11_(cmMakefile *mf)

{
  cmMakefile *this;
  bool bVar1;
  int iVar2;
  string *local_80;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue suffixProp;
  allocator<char> local_11;
  cmMakefile *local_10;
  cmMakefile *mf_local;
  
  local_10 = mf;
  if (get_suffixes[abi:cxx11](cmMakefile*)::defaultSuffix_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&get_suffixes[abi:cxx11](cmMakefile*)::defaultSuffix_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&get_suffixes[abi:cxx11](cmMakefile*)::defaultSuffix_abi_cxx11_,".so;.a",
                 &local_11);
      std::allocator<char>::~allocator(&local_11);
      __cxa_atexit(std::__cxx11::string::~string,
                   &get_suffixes[abi:cxx11](cmMakefile*)::defaultSuffix_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&get_suffixes[abi:cxx11](cmMakefile*)::defaultSuffix_abi_cxx11_);
    }
  }
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_FIND_LIBRARY_SUFFIXES",&local_51);
  local_30 = cmMakefile::GetDefinition(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = cmValue::operator_cast_to_bool(&local_30);
  if (bVar1) {
    local_80 = cmValue::operator*[abi_cxx11_(&local_30);
  }
  else {
    local_80 = &get_suffixes[abi:cxx11](cmMakefile*)::defaultSuffix_abi_cxx11_;
  }
  return local_80;
}

Assistant:

std::string const& get_suffixes(cmMakefile* mf)
{
#ifdef _WIN32
  static std::string defaultSuffix = ".lib;.dll.a;.a";
#elif defined(__APPLE__)
  static std::string defaultSuffix = ".tbd;.dylib;.so;.a";
#elif defined(__hpux)
  static std::string defaultSuffix = ".sl;.so;.a";
#else
  static std::string defaultSuffix = ".so;.a";
#endif
  cmValue suffixProp = mf->GetDefinition("CMAKE_FIND_LIBRARY_SUFFIXES");
  return (suffixProp) ? *suffixProp : defaultSuffix;
}